

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O3

void AS_02::ACES::PictureDescriptorDump(PictureDescriptor *PDesc,FILE *stream)

{
  long lVar1;
  pointer pcVar2;
  pointer pcVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (stream == (FILE *)0x0) {
    stream = (FILE *)_stderr;
  }
  fprintf((FILE *)stream,"          EditRate: %i/%i\n",(ulong)(uint)(PDesc->EditRate).Numerator,
          (ulong)(uint)(PDesc->EditRate).Denominator);
  fprintf((FILE *)stream,"        SampleRate: %i/%i\n",(ulong)(uint)(PDesc->SampleRate).Numerator,
          (ulong)(uint)(PDesc->SampleRate).Denominator);
  fwrite("    Chromaticities: \n",0x15,1,(FILE *)stream);
  fprintf((FILE *)stream,"               x_red: %f y_red: %f\n",
          (double)(float)(PDesc->Chromaticities).red.x,(double)(float)(PDesc->Chromaticities).red.y)
  ;
  fprintf((FILE *)stream,"             x_green: %f y_green: %f\n",
          (double)(float)(PDesc->Chromaticities).green.x,
          (double)(float)(PDesc->Chromaticities).green.y);
  fprintf((FILE *)stream,"              x_blue: %f y_blue: %f\n",
          (double)(float)(PDesc->Chromaticities).blue.x,
          (double)(float)(PDesc->Chromaticities).blue.y);
  fprintf((FILE *)stream,"             x_white: %f y_white: %f\n",
          (double)(float)(PDesc->Chromaticities).white.x,
          (double)(float)(PDesc->Chromaticities).white.y);
  fprintf((FILE *)stream,"       Compression: %u\n",(ulong)PDesc->Compression);
  fprintf((FILE *)stream,"         LineOrder: %u\n",(ulong)PDesc->LineOrder);
  fwrite("        DataWindow: \n",0x15,1,(FILE *)stream);
  fprintf((FILE *)stream,"                xMin: %i\n",(ulong)(uint)(PDesc->DataWindow).xMin);
  fprintf((FILE *)stream,"                yMin: %i\n",(ulong)(uint)(PDesc->DataWindow).yMin);
  fprintf((FILE *)stream,"                xMax: %i\n",(ulong)(uint)(PDesc->DataWindow).xMax);
  fprintf((FILE *)stream,"                yMax: %i\n",(ulong)(uint)(PDesc->DataWindow).yMax);
  fwrite("     DisplayWindow: \n",0x15,1,(FILE *)stream);
  fprintf((FILE *)stream,"                xMin: %i\n",(ulong)(uint)(PDesc->DisplayWindow).xMin);
  fprintf((FILE *)stream,"                yMin: %i\n",(ulong)(uint)(PDesc->DisplayWindow).yMin);
  fprintf((FILE *)stream,"                xMax: %i\n",(ulong)(uint)(PDesc->DisplayWindow).xMax);
  fprintf((FILE *)stream,"                yMax: %i\n",(ulong)(uint)(PDesc->DisplayWindow).yMax);
  fprintf((FILE *)stream,"  PixelAspectRatio: %f \n",(double)(float)PDesc->PixelAspectRatio);
  fprintf((FILE *)stream,"ScreenWindowCenter: x: %f y: %f\n",
          (double)(float)(PDesc->ScreenWindowCenter).x,(double)(float)(PDesc->ScreenWindowCenter).y)
  ;
  fprintf((FILE *)stream," ScreenWindowWidth: %f\n",(double)(float)PDesc->ScreenWindowWidth);
  fwrite("          Channels: \n",0x15,1,(FILE *)stream);
  pcVar2 = (PDesc->Channels).
           super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (PDesc->Channels).
           super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar3 != pcVar2) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      if (pcVar2[uVar4].name._M_string_length != 0) {
        fprintf((FILE *)stream,"                Name: %s\n",pcVar2[uVar4].name._M_dataplus._M_p);
        fprintf((FILE *)stream,"           pixelType: %i\n",
                (ulong)(uint)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].pixelType);
        fprintf((FILE *)stream,"             pLinear: %u\n",
                (ulong)(PDesc->Channels).
                       super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar4].pLinear);
        fprintf((FILE *)stream,"           xSampling: %i\n",
                (ulong)(uint)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].xSampling);
        fprintf((FILE *)stream,"           ySampling: %i\n",
                (ulong)(uint)(PDesc->Channels).
                             super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar4].ySampling);
        pcVar2 = (PDesc->Channels).
                 super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (PDesc->Channels).
                 super__Vector_base<AS_02::ACES::channel,_std::allocator<AS_02::ACES::channel>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar4 = ((long)pcVar3 - (long)pcVar2 >> 4) * -0x5555555555555555;
      bVar6 = uVar5 <= uVar4;
      lVar1 = uVar4 - uVar5;
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar6 && lVar1 != 0);
  }
  fprintf((FILE *)stream,"Number of other entries: %lu\n",
          ((long)(PDesc->Other).
                 super__Vector_base<AS_02::ACES::generic,_std::allocator<AS_02::ACES::generic>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(PDesc->Other).
                 super__Vector_base<AS_02::ACES::generic,_std::allocator<AS_02::ACES::generic>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x133f84cfe133f84d);
  return;
}

Assistant:

void AS_02::ACES::PictureDescriptorDump(const PictureDescriptor &PDesc, FILE *stream /*= NULL*/)
{

  if(stream == NULL) stream = stderr;
  fprintf(stream, "          EditRate: %i/%i\n", PDesc.EditRate.Numerator, PDesc.EditRate.Denominator);
  fprintf(stream, "        SampleRate: %i/%i\n", PDesc.SampleRate.Numerator, PDesc.SampleRate.Denominator);
  fprintf(stream, "    Chromaticities: \n");
  fprintf(stream, "               x_red: %f y_red: %f\n", (double)PDesc.Chromaticities.red.x, (double)PDesc.Chromaticities.red.y);
  fprintf(stream, "             x_green: %f y_green: %f\n", (double)PDesc.Chromaticities.green.x, (double)PDesc.Chromaticities.green.y);
  fprintf(stream, "              x_blue: %f y_blue: %f\n", (double)PDesc.Chromaticities.blue.x, (double)PDesc.Chromaticities.blue.y);
  fprintf(stream, "             x_white: %f y_white: %f\n", (double)PDesc.Chromaticities.white.x, (double)PDesc.Chromaticities.white.y);
  fprintf(stream, "       Compression: %u\n", (unsigned)PDesc.Compression);
  fprintf(stream, "         LineOrder: %u\n", (unsigned)PDesc.LineOrder);
  fprintf(stream, "        DataWindow: \n");
  fprintf(stream, "                xMin: %i\n", PDesc.DataWindow.xMin);
  fprintf(stream, "                yMin: %i\n", PDesc.DataWindow.yMin);
  fprintf(stream, "                xMax: %i\n", PDesc.DataWindow.xMax);
  fprintf(stream, "                yMax: %i\n", PDesc.DataWindow.yMax);
  fprintf(stream, "     DisplayWindow: \n");
  fprintf(stream, "                xMin: %i\n", PDesc.DisplayWindow.xMin);
  fprintf(stream, "                yMin: %i\n", PDesc.DisplayWindow.yMin);
  fprintf(stream, "                xMax: %i\n", PDesc.DisplayWindow.xMax);
  fprintf(stream, "                yMax: %i\n", PDesc.DisplayWindow.yMax);
  fprintf(stream, "  PixelAspectRatio: %f \n", (double)PDesc.PixelAspectRatio);
  fprintf(stream, "ScreenWindowCenter: x: %f y: %f\n", (double)PDesc.ScreenWindowCenter.x, (double)PDesc.ScreenWindowCenter.y);
  fprintf(stream, " ScreenWindowWidth: %f\n", (double)PDesc.ScreenWindowWidth);
  fprintf(stream, "          Channels: \n");

  for(ui32_t i = 0; i < PDesc.Channels.size(); i++)
  {
    if(PDesc.Channels[i].name.empty() == false)
    {
      fprintf(stream, "                Name: %s\n", PDesc.Channels[i].name.c_str());
      fprintf(stream, "           pixelType: %i\n", PDesc.Channels[i].pixelType);
      fprintf(stream, "             pLinear: %u\n", PDesc.Channels[i].pLinear);
      fprintf(stream, "           xSampling: %i\n", PDesc.Channels[i].xSampling);
      fprintf(stream, "           ySampling: %i\n", PDesc.Channels[i].ySampling);
    }
  }
  fprintf(stream, "Number of other entries: %lu\n", PDesc.Other.size());
}